

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strftime_format.cpp
# Opt level: O1

string_t __thiscall
duckdb::StrfTimeFormat::ConvertTimestampValue
          (StrfTimeFormat *this,timestamp_ns_t *input,Vector *result)

{
  timestamp_ns_t input_00;
  StrTimeSpecifier *pSVar1;
  date_t date_00;
  idx_t iVar2;
  ulong uVar3;
  idx_t extraout_RDX;
  idx_t extraout_RDX_00;
  char *target_00;
  const_iterator __begin2;
  StrTimeSpecifier *pSVar4;
  Vector *vector;
  date_t date;
  string_t target;
  int32_t data [8];
  int32_t nanos;
  dtime_t time;
  date_t local_7c;
  undefined1 local_78 [16];
  string local_68;
  Vector *local_48;
  int local_3c;
  dtime_t local_38;
  
  input_00 = (timestamp_ns_t)(input->super_timestamp_t).value;
  if ((input_00.super_timestamp_t.value == -0x7fffffffffffffff) ||
     (input_00.super_timestamp_t.value == 0x7fffffffffffffff)) {
    Timestamp::ToString_abi_cxx11_
              (&local_68,(Timestamp *)input_00.super_timestamp_t.value,(timestamp_t)result);
    local_78 = (undefined1  [16])StringVector::AddString(result,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
  }
  else {
    local_48 = result;
    Timestamp::Convert(input_00,&local_7c,&local_38,&local_3c);
    Date::Convert(local_7c,(int32_t *)&local_68,(int32_t *)((long)&local_68._M_dataplus._M_p + 4),
                  (int32_t *)&local_68._M_string_length);
    Time::Convert(local_38,(int32_t *)((long)&local_68._M_string_length + 4),
                  (int32_t *)local_68.field_2._M_local_buf,
                  (int32_t *)(local_68.field_2._M_local_buf + 4),
                  (int32_t *)(local_68.field_2._M_local_buf + 8));
    date_00.days = local_7c.days;
    local_68.field_2._8_4_ = local_68.field_2._8_4_ * 1000 + local_3c;
    local_68.field_2._12_4_ = 0;
    vector = (Vector *)(this->super_StrTimeFormat).constant_size;
    pSVar4 = (this->var_length_specifiers).
             super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
             super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pSVar1 = (this->var_length_specifiers).
             super_vector<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>.
             super__Vector_base<duckdb::StrTimeSpecifier,_std::allocator<duckdb::StrTimeSpecifier>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    iVar2 = extraout_RDX;
    if (pSVar4 != pSVar1) {
      do {
        iVar2 = GetSpecifierLength(*pSVar4,date_00,(int32_t *)&local_68,(char *)0x0);
        vector = (Vector *)(&vector->vector_type + iVar2);
        pSVar4 = pSVar4 + 1;
        iVar2 = extraout_RDX_00;
      } while (pSVar4 != pSVar1);
    }
    local_78 = (undefined1  [16])StringVector::EmptyString((StringVector *)local_48,vector,iVar2);
    target_00 = local_78._8_8_;
    if (local_78._0_4_ < 0xd) {
      target_00 = local_78 + 4;
    }
    FormatStringNS(this,local_7c,(int32_t *)&local_68,(char *)0x0,target_00);
    uVar3 = (ulong)(uint)local_78._0_4_;
    if (uVar3 < 0xd) {
      switchD_01306cb1::default(local_78 + 4 + uVar3,0,0xc - uVar3);
    }
    else {
      local_78._4_4_ = *(undefined4 *)local_78._8_8_;
    }
  }
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)local_78;
}

Assistant:

string_t StrfTimeFormat::ConvertTimestampValue(const timestamp_ns_t &input, Vector &result) const {
	if (Timestamp::IsFinite(input)) {
		date_t date;
		dtime_t time;
		int32_t nanos;
		Timestamp::Convert(input, date, time, nanos);

		int32_t data[8]; // year, month, day, hour, min, sec, ns, offset
		Date::Convert(date, data[0], data[1], data[2]);
		Time::Convert(time, data[3], data[4], data[5], data[6]);
		data[6] *= Interval::NANOS_PER_MICRO;
		data[6] += nanos;
		data[7] = 0;
		const char *tz_name = nullptr;

		idx_t len = GetLength(date, data, tz_name);
		string_t target = StringVector::EmptyString(result, len);
		FormatStringNS(date, data, tz_name, target.GetDataWriteable());
		target.Finalize();
		return target;
	} else {
		return StringVector::AddString(result, Timestamp::ToString(input));
	}
}